

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

boolean occupied(level *lev,xchar x,xchar y)

{
  boolean bVar1;
  trap *ptVar2;
  bool local_13;
  xchar y_local;
  xchar x_local;
  level *lev_local;
  
  ptVar2 = t_at(lev,(int)x,(int)y);
  local_13 = true;
  if ((ptVar2 == (trap *)0x0) &&
     ((lev->locations[x][y].typ < '\x1a' || (local_13 = true, '!' < lev->locations[x][y].typ)))) {
    bVar1 = is_lava(lev,(int)x,(int)y);
    local_13 = true;
    if (bVar1 == '\0') {
      bVar1 = is_pool(lev,(int)x,(int)y);
      local_13 = true;
      if (bVar1 == '\0') {
        bVar1 = invocation_pos(&lev->z,x,y);
        local_13 = bVar1 != '\0';
      }
    }
  }
  return local_13;
}

Assistant:

boolean occupied(struct level *lev, xchar x, xchar y)
{
	return((boolean)(t_at(lev, x, y)
		|| IS_FURNITURE(lev->locations[x][y].typ)
		|| is_lava(lev, x, y)
		|| is_pool(lev, x, y)
		|| invocation_pos(&lev->z, x, y)
		));
}